

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QGles2CommandBuffer::QGles2CommandBuffer(QGles2CommandBuffer *this,QRhiImplementation *rhi)

{
  QVarLengthArray<std::function<void_(QRhi_*)>,_4LL> *pQVar1;
  QGles2CommandBuffer *in_RSI;
  QRhiImplementation *in_RDI;
  
  QRhiCommandBuffer::QRhiCommandBuffer(&in_RSI->super_QRhiCommandBuffer,in_RDI);
  in_RDI->_vptr_QRhiImplementation = (_func_int **)&PTR__QGles2CommandBuffer_00e21370;
  QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::QRhiBackendCommandList
            ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)&in_RDI->implThread);
  QVarLengthArray<QRhiPassResourceTracker,_8LL>::QVarLengthArray
            ((QVarLengthArray<QRhiPassResourceTracker,_8LL> *)
             &(in_RDI->resUpdPool).super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.s);
  pQVar1 = &in_RDI->cleanupCallbacks;
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x40] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x41] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x42] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x43] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x44] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x45] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x46] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x47] = '\0';
  GraphicsPassState::GraphicsPassState((GraphicsPassState *)0x932ae8);
  ComputePassState::ComputePassState((ComputePassState *)0x932af8);
  QVarLengthArray<QByteArray,_4LL>::QVarLengthArray
            ((QVarLengthArray<QByteArray,_4LL> *)&in_RDI[3].resources);
  QVarLengthArray<QRhiBufferData,_4LL>::QVarLengthArray
            ((QVarLengthArray<QRhiBufferData,_4LL> *)
             (in_RDI[3].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x50));
  QVarLengthArray<QImage,_4LL>::QVarLengthArray
            ((QVarLengthArray<QImage,_4LL> *)&in_RDI[3].pipelineCreationTimer);
  resetState(in_RSI);
  return;
}

Assistant:

QGles2CommandBuffer::QGles2CommandBuffer(QRhiImplementation *rhi)
    : QRhiCommandBuffer(rhi)
{
    resetState();
}